

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::Scene::writeTo(Scene *this,BinaryWriter *binary)

{
  int32_t local_3c;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Film,void>
            (local_28,&(this->film).super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>);
  local_3c = BinaryWriter::serialize(binary,(SP *)local_28);
  BinaryWriter::write<int>(binary,&local_3c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  BinaryWriter::
  write<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>,void,void>
            (binary,&this->cameras);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Object,void>
            (local_38,&(this->world).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>);
  local_3c = BinaryWriter::serialize(binary,(SP *)local_38);
  BinaryWriter::write<int>(binary,&local_3c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return 1;
}

Assistant:

int Scene::writeTo(BinaryWriter &binary) 
  {
    binary.write(binary.serialize(film));
    binary.write(cameras);
    binary.write(binary.serialize(world));
    return TYPE_SCENE;
  }